

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void NavRestoreLayer(ImGuiNavLayer layer)

{
  ImGuiID IVar1;
  ImGuiContext *pIVar2;
  ImGuiWindow *pIVar3;
  
  pIVar2 = GImGui;
  GImGui->NavLayer = layer;
  if (layer == ImGuiNavLayer_Main) {
    pIVar3 = pIVar2->NavWindow->NavLastChildNavWindow;
    if ((pIVar3 == (ImGuiWindow *)0x0) || (pIVar3->WasActive == false)) {
      pIVar3 = pIVar2->NavWindow;
    }
    pIVar2->NavWindow = pIVar3;
  }
  pIVar3 = pIVar2->NavWindow;
  if ((layer == ImGuiNavLayer_Main) && (IVar1 = pIVar3->NavLastIds[0], IVar1 != 0)) {
    if (pIVar3 != (ImGuiWindow *)0x0) {
      pIVar2->NavId = IVar1;
      pIVar2->NavFocusScopeId = 0;
      pIVar3->NavLastIds[0] = IVar1;
      pIVar2->NavMousePosDirty = true;
      pIVar2->NavDisableHighlight = false;
      pIVar2->NavDisableMouseHover = true;
      return;
    }
    __assert_fail("g.NavWindow",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Bktero[P]HelloWorldWithDearImGui/build_O1/_deps/imgui-src/imgui.cpp"
                  ,0x20a6,"void ImGui::SetNavID(ImGuiID, int, ImGuiID)");
  }
  ImGui::NavInitWindow(pIVar3,true);
  return;
}

Assistant:

static void NavRestoreLayer(ImGuiNavLayer layer)
{
    ImGuiContext& g = *GImGui;
    g.NavLayer = layer;
    if (layer == 0)
        g.NavWindow = ImGui::NavRestoreLastChildNavWindow(g.NavWindow);
    ImGuiWindow* window = g.NavWindow;
    if (layer == 0 && window->NavLastIds[0] != 0)
        ImGui::SetNavIDWithRectRel(window->NavLastIds[0], layer, 0, window->NavRectRel[0]);
    else
        ImGui::NavInitWindow(window, true);
}